

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.h
# Opt level: O1

void chrono::ChQuadrature::Integrate3D<Eigen::Matrix<double,33,33,1,33,33>>
               (Matrix<double,_33,_33,_1,_33,_33> *result,
               ChIntegrable3D<Eigen::Matrix<double,_33,_33,_1,_33,_33>_> *integrand,double Xa,
               double Xb,double Ya,double Yb,double Za,double Zb,int order)

{
  ulong uVar1;
  void *pvVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Index index;
  ChQuadratureTables *pCVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  undefined8 uVar17;
  Index alignedStart_1;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ActualDstType actualDst;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  pointer pvVar24;
  ulong uVar25;
  Index index_1;
  ulong uVar26;
  Index alignedEnd;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Matrix<double,_33,_33,_1,_33,_33> val;
  ChQuadratureTables *local_2278;
  pointer local_2270;
  double local_2238 [1089];
  
  pCVar13 = GetStaticTables();
  uVar25 = ((long)(pCVar13->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pCVar13->Lroots).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar25 < (uint)order) {
    local_2278 = (ChQuadratureTables *)::operator_new(0x30);
    ChQuadratureTables::ChQuadratureTables(local_2278,order,order);
    ChQuadratureTables::PrintTables(local_2278);
    local_2270 = (local_2278->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    pvVar24 = (local_2278->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    local_2278 = GetStaticTables();
    pvVar24 = (local_2278->Lroots).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
    local_2270 = (local_2278->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)order + -1;
  }
  dVar8 = (Xb - Xa) * 0.5;
  dVar9 = (Yb - Ya) * 0.5;
  dVar10 = (Zb - Za) * 0.5;
  uVar18 = (ulong)((uint)result >> 3 & 1);
  uVar1 = uVar18 + 0x440;
  uVar14 = uVar18;
  if (((uint)result >> 3 & 1) != 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
               m_data.array[0] * 0.0;
  }
  do {
    pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar14;
    dVar11 = pdVar3[1];
    pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar14;
    *pdVar4 = *pdVar3 * 0.0;
    pdVar4[1] = dVar11 * 0.0;
    uVar14 = uVar14 + 2;
  } while (uVar14 < uVar1);
  if (uVar18 == 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0x440] = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                   m_storage.m_data.array[0x440] * 0.0;
  }
  if ((pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish !=
      (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start) {
    pvVar23 = (void *)(ulong)((uint)local_2238 >> 3 & 1);
    pvVar2 = (void *)((long)pvVar23 + 0x440);
    uVar14 = 0;
    do {
      if ((pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar26 = 0;
        do {
          lVar15 = *(long *)&(pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data;
          lVar19 = (long)(pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_finish - lVar15;
          if (lVar19 != 0) {
            uVar20 = lVar19 >> 3;
            uVar21 = 0;
            do {
              uVar22 = uVar14;
              if ((uVar20 <= uVar14) || (uVar22 = uVar26, uVar20 <= uVar26)) {
LAB_006f8160:
                uVar17 = std::__throw_out_of_range_fmt
                                   ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                    ,uVar22);
                operator_delete(pvVar2,0x30);
                _Unwind_Resume(uVar17);
              }
              auVar27._8_8_ = 0;
              auVar27._0_8_ = *(ulong *)(lVar15 + uVar14 * 8);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = (Xa + Xb) * 0.5;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = dVar8;
              auVar5 = vfmadd132sd_fma(auVar27,auVar28,auVar5);
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)(lVar15 + uVar26 * 8);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = (Ya + Yb) * 0.5;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dVar9;
              auVar6 = vfmadd132sd_fma(auVar29,auVar30,auVar6);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(lVar15 + uVar21 * 8);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = (Za + Zb) * 0.5;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = dVar10;
              auVar7 = vfmadd132sd_fma(auVar31,auVar32,auVar7);
              (*integrand->_vptr_ChIntegrable3D[2])
                        (auVar5._0_8_,auVar6._0_8_,auVar7._0_8_,integrand,local_2238);
              lVar15 = *(long *)&(local_2270->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl;
              uVar20 = (long)(local_2270->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_finish - lVar15 >> 3;
              uVar22 = uVar14;
              if ((uVar20 <= uVar14) ||
                 ((uVar22 = uVar26, uVar20 <= uVar26 || (uVar22 = uVar21, uVar20 <= uVar21))))
              goto LAB_006f8160;
              dVar11 = *(double *)(lVar15 + uVar14 * 8) * *(double *)(lVar15 + uVar26 * 8) *
                       *(double *)(lVar15 + uVar21 * 8);
              pvVar16 = pvVar23;
              if (pvVar23 != (void *)0x0) {
                local_2238[0] = dVar11 * local_2238[0];
              }
              do {
                local_2238[(long)pvVar16] = dVar11 * local_2238[(long)pvVar16];
                local_2238[(long)pvVar16 + 1] = dVar11 * local_2238[(long)pvVar16 + 1];
                pvVar16 = (void *)((long)pvVar16 + 2);
              } while (pvVar16 < pvVar2);
              if (pvVar23 == (void *)0x0) {
                local_2238[(long)pvVar2] = dVar11 * local_2238[(long)pvVar2];
              }
              uVar20 = uVar18;
              if (uVar18 != 0) {
                (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage
                .m_data.array[0] =
                     local_2238[0] +
                     (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                     m_storage.m_data.array[0];
              }
              do {
                dVar11 = local_2238[uVar20 + 1];
                pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                         m_storage.m_data.array + uVar20;
                dVar12 = pdVar3[1];
                pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                         m_storage.m_data.array + uVar20;
                *pdVar4 = local_2238[uVar20] + *pdVar3;
                pdVar4[1] = dVar11 + dVar12;
                uVar20 = uVar20 + 2;
              } while (uVar20 < uVar1);
              if (uVar18 == 0) {
                uVar20 = (ulong)(uint)((int)uVar1 * 8);
                *(double *)
                 ((long)(result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                        m_storage.m_data.array + uVar20) =
                     *(double *)((long)local_2238 + uVar20) +
                     *(double *)
                      ((long)(result->
                             super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                             m_storage.m_data.array + uVar20);
              }
              uVar21 = (ulong)((int)uVar21 + 1);
              lVar15 = *(long *)&(pvVar24->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data;
              uVar20 = (long)(pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_finish - lVar15 >> 3;
            } while (uVar21 < uVar20);
          }
          uVar26 = (ulong)((int)uVar26 + 1);
        } while (uVar26 < (ulong)((long)(pvVar24->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data._M_finish -
                                  *(long *)&(pvVar24->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data >> 3));
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 < (ulong)((long)(pvVar24->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              *(long *)&(pvVar24->
                                        super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                        .super__Vector_impl_data >> 3));
  }
  dVar10 = dVar9 * dVar8 * dVar10;
  uVar14 = uVar18;
  if (uVar18 != 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0] = dVar10 * (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                        m_storage.m_data.array[0];
  }
  do {
    pdVar3 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar14;
    dVar8 = pdVar3[1];
    pdVar4 = (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.
             m_data.array + uVar14;
    *pdVar4 = dVar10 * *pdVar3;
    pdVar4[1] = dVar10 * dVar8;
    uVar14 = uVar14 + 2;
  } while (uVar14 < uVar1);
  if (uVar18 == 0) {
    (result->super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).m_storage.m_data.
    array[0x440] = dVar10 * (result->
                            super_PlainObjectBase<Eigen::Matrix<double,_33,_33,_1,_33,_33>_>).
                            m_storage.m_data.array[0x440];
  }
  if (uVar25 < (uint)order) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2278->Lroots);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_2278->Weight);
    operator_delete(local_2278,0x30);
  }
  return;
}

Assistant:

static void Integrate3D(T& result,                     ///< result is returned here
                            ChIntegrable3D<T>& integrand,  ///< this is the integrand
                            const double Xa,               ///< min limit for x domain
                            const double Xb,               ///< min limit for x domain
                            const double Ya,               ///< min limit for y domain
                            const double Yb,               ///< min limit for y domain
                            const double Za,               ///< min limit for z domain
                            const double Zb,               ///< min limit for z domain
                            const int order)               ///< order of integration
    {
        ChQuadratureTables* mtables = 0;
        std::vector<double>* lroots;
        std::vector<double>* weight;
        bool static_tables;

        if ((unsigned int)order <= GetStaticTables()->Lroots.size()) {
            mtables = GetStaticTables();
            lroots = &mtables->Lroots[order - 1];
            weight = &mtables->Weight[order - 1];
            static_tables = true;
        } else {
            mtables = new ChQuadratureTables(order, order);
            mtables->PrintTables();
            lroots = &mtables->Lroots[0];
            weight = &mtables->Weight[0];
            static_tables = false;
        }

        double Xc1 = (Xb - Xa) / 2;
        double Xc2 = (Xb + Xa) / 2;
        double Yc1 = (Yb - Ya) / 2;
        double Yc2 = (Yb + Ya) / 2;
        double Zc1 = (Zb - Za) / 2;
        double Zc2 = (Zb + Za) / 2;

        result *= 0;  // as result = 0, but works also for matrices.
        T val;        // temporary value for loop

        for (unsigned int ix = 0; ix < lroots->size(); ix++)
            for (unsigned int iy = 0; iy < lroots->size(); iy++)
                for (unsigned int iz = 0; iz < lroots->size(); iz++) {
                    integrand.Evaluate(val, (Xc1 * lroots->at(ix) + Xc2), (Yc1 * lroots->at(iy) + Yc2),
                                       (Zc1 * lroots->at(iz) + Zc2));
                    val *= (weight->at(ix) * weight->at(iy) * weight->at(iz));
                    result += val;
                }
        result *= (Xc1 * Yc1 * Zc1);

        if (!static_tables)
            delete mtables;
    }